

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm.cpp
# Opt level: O1

int __thiscall ncnn::GroupNorm::forward_inplace(GroupNorm *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  ulong uVar6;
  size_t sVar7;
  void *pvVar8;
  void *pvVar9;
  uint uVar10;
  float *ptr;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  int i_1;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  int i;
  long lVar19;
  long lVar20;
  long lVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  float fVar27;
  
  uVar10 = this->channels / this->group;
  if (0 < this->group) {
    uVar15 = bottom_top_blob->h * bottom_top_blob->w;
    iVar1 = bottom_top_blob->dims;
    iVar2 = bottom_top_blob->d;
    pvVar5 = bottom_top_blob->data;
    uVar6 = bottom_top_blob->elemsize;
    sVar7 = bottom_top_blob->cstep;
    lVar13 = (long)bottom_top_blob->h * (long)bottom_top_blob->w * uVar6;
    uVar18 = (ulong)uVar10;
    uVar12 = (ulong)uVar15;
    fVar22 = 1.0 / (float)(int)(uVar10 * uVar15);
    iVar3 = this->affine;
    iVar4 = this->group;
    lVar21 = 0;
    do {
      lVar14 = sVar7 * uVar6 * lVar21 * (int)uVar10;
      lVar19 = iVar2 * lVar13;
      if (iVar1 == 3) {
        lVar19 = lVar13;
      }
      uVar11 = (lVar19 + 0xfU & 0xfffffffffffffff0) / uVar6;
      fVar23 = 0.0;
      fVar24 = 0.0;
      if (0 < (int)uVar10) {
        uVar17 = 0;
        do {
          if (0 < (int)uVar15) {
            lVar19 = 0;
            uVar16 = uVar12;
            do {
              fVar24 = fVar24 + *(float *)((long)pvVar5 +
                                          lVar19 * 4 + uVar11 * uVar6 * uVar17 + lVar14);
              lVar19 = lVar19 + 1;
              uVar16 = uVar16 - 1;
            } while (uVar16 != 0);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar18);
      }
      fVar24 = fVar24 * fVar22;
      if (0 < (int)uVar10) {
        fVar23 = 0.0;
        uVar17 = 0;
        do {
          if (0 < (int)uVar15) {
            lVar19 = 0;
            uVar16 = uVar12;
            do {
              fVar25 = *(float *)((long)pvVar5 + lVar19 * 4 + uVar11 * uVar6 * uVar17 + lVar14) -
                       fVar24;
              fVar23 = fVar23 + fVar25 * fVar25;
              lVar19 = lVar19 + 1;
              uVar16 = uVar16 - 1;
            } while (uVar16 != 0);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar18);
      }
      if (0 < (int)uVar10) {
        fVar23 = fVar23 * fVar22;
        pvVar8 = (this->gamma_data).data;
        pvVar9 = (this->beta_data).data;
        uVar17 = 0;
        do {
          if (iVar3 == 0) {
            fVar27 = this->eps + fVar23;
            auVar26 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar27));
            fVar25 = auVar26._0_4_;
            fVar25 = fVar25 * -0.5 * (fVar27 * fVar25 * fVar25 + -3.0);
            fVar27 = fVar25 * -fVar24;
          }
          else {
            lVar19 = uVar17 + (lVar21 * (int)uVar10 & 0xffffffffU);
            fVar27 = this->eps + fVar23;
            auVar26 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar27));
            fVar25 = auVar26._0_4_;
            fVar25 = fVar25 * -0.5 * (fVar27 * fVar25 * fVar25 + -3.0) *
                     *(float *)((long)pvVar8 + lVar19 * 4);
            fVar27 = *(float *)((long)pvVar9 + lVar19 * 4) - fVar25 * fVar24;
          }
          if (0 < (int)uVar15) {
            lVar19 = uVar11 * uVar6 * uVar17 + lVar14;
            lVar20 = 0;
            uVar16 = uVar12;
            do {
              *(float *)((long)pvVar5 + lVar20 * 4 + lVar19) =
                   *(float *)((long)pvVar5 + lVar20 * 4 + lVar19) * fVar25 + fVar27;
              lVar20 = lVar20 + 1;
              uVar16 = uVar16 - 1;
            } while (uVar16 != 0);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar18);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < iVar4);
  }
  return 0;
}

Assistant:

int GroupNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / sqrt(var + eps) * gamma + beta

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int size = w * h;

    int channels_per_group = channels / group;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);

        // mean and var
        float sum = 0.f;
        for (int q = 0; q < channels_per_group; q++)
        {
            const float* ptr = bottom_top_blob_g.channel(q);
            for (int i = 0; i < size; i++)
            {
                sum += ptr[i];
            }
        }
        float mean = sum / (channels_per_group * size);

        float sqsum = 0.f;
        for (int q = 0; q < channels_per_group; q++)
        {
            const float* ptr = bottom_top_blob_g.channel(q);
            for (int i = 0; i < size; i++)
            {
                float tmp = ptr[i] - mean;
                sqsum += tmp * tmp;
            }
        }
        float var = sqsum / (channels_per_group * size);

        for (int q = 0; q < channels_per_group; q++)
        {
            float a;
            float b;
            if (affine)
            {
                float gamma = gamma_data[g * channels_per_group + q];
                float beta = beta_data[g * channels_per_group + q];

                a = static_cast<float>(gamma / sqrt(var + eps));
                b = -mean * a + beta;
            }
            else
            {
                a = static_cast<float>(1.f / (sqrt(var + eps)));
                b = -mean * a;
            }

            float* ptr = bottom_top_blob_g.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = ptr[i] * a + b;
            }
        }
    }

    return 0;
}